

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_MergeExtensions_Test::TestBody
          (ReflectionOpsTest_MergeExtensions_Test *this)

{
  ExtensionSet *this_00;
  pointer pcVar1;
  int iVar2;
  int32_t iVar3;
  string *psVar4;
  TestAllExtensions message;
  TestAllExtensions message2;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_90,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_60,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_90);
  this_00 = (ExtensionSet *)(local_90 + 0x10);
  iVar3 = ExtensionSet::GetInt32(this_00,proto2_unittest::optional_int32_extension,DAT_019a4044);
  ExtensionSet::SetInt32
            ((ExtensionSet *)(local_60 + 0x10),proto2_unittest::optional_int32_extension,'\x05',
             iVar3,(FieldDescriptor *)0x0);
  ExtensionSet::ClearExtension(this_00,proto2_unittest::optional_int32_extension);
  psVar4 = ExtensionSet::GetString
                     (this_00,proto2_unittest::optional_string_extension,
                      (string *)PTR_optional_string_extension_default_abi_cxx11__019a40e0);
  iVar2 = proto2_unittest::optional_string_extension;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + psVar4->_M_string_length);
  psVar4 = ExtensionSet::MutableString_abi_cxx11_
                     ((ExtensionSet *)(local_60 + 0x10),iVar2,'\f',(FieldDescriptor *)0x0);
  std::__cxx11::string::operator=((string *)psVar4,(string *)local_d0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"something else","");
  iVar2 = proto2_unittest::optional_string_extension;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,local_b0,local_a8 + (long)local_b0);
  psVar4 = ExtensionSet::MutableString_abi_cxx11_(this_00,iVar2,'\f',(FieldDescriptor *)0x0);
  std::__cxx11::string::operator=((string *)psVar4,(string *)local_d0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  iVar3 = ExtensionSet::GetRepeatedInt32(this_00,proto2_unittest::repeated_int32_extension,1);
  ExtensionSet::AddInt32
            ((ExtensionSet *)(local_60 + 0x10),proto2_unittest::repeated_int32_extension,'\x05',
             false,iVar3,(FieldDescriptor *)0x0);
  iVar3 = ExtensionSet::GetRepeatedInt32(this_00,proto2_unittest::repeated_int32_extension,0);
  ExtensionSet::ClearExtension(this_00,proto2_unittest::repeated_int32_extension);
  ExtensionSet::AddInt32
            (this_00,proto2_unittest::repeated_int32_extension,'\x05',false,iVar3,
             (FieldDescriptor *)0x0);
  ReflectionOps::Merge((Message *)local_60,(Message *)local_90);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_90);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_60);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_90);
  return;
}

Assistant:

TEST(ReflectionOpsTest, MergeExtensions) {
  // Note:  Copy is implemented in terms of Merge() so technically the Copy
  //   test already tested most of this.

  unittest::TestAllExtensions message, message2;

  TestUtil::SetAllExtensions(&message);

  // This field will test merging into an empty spot.
  message2.SetExtension(
      unittest::optional_int32_extension,
      message.GetExtension(unittest::optional_int32_extension));
  message.ClearExtension(unittest::optional_int32_extension);

  // This tests overwriting.
  message2.SetExtension(
      unittest::optional_string_extension,
      message.GetExtension(unittest::optional_string_extension));
  message.SetExtension(unittest::optional_string_extension, "something else");

  // This tests concatenating.
  message2.AddExtension(
      unittest::repeated_int32_extension,
      message.GetExtension(unittest::repeated_int32_extension, 1));
  int32_t i = message.GetExtension(unittest::repeated_int32_extension, 0);
  message.ClearExtension(unittest::repeated_int32_extension);
  message.AddExtension(unittest::repeated_int32_extension, i);

  ReflectionOps::Merge(message2, &message);

  TestUtil::ExpectAllExtensionsSet(message);
}